

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

QList<QGraphicsItem_*> * __thiscall
QGraphicsView::items(QGraphicsView *this,QRect *rect,ItemSelectionMode mode)

{
  long lVar1;
  bool bVar2;
  QGraphicsViewPrivate *this_00;
  QGraphicsView *in_RSI;
  QRect *in_RDI;
  long in_FS_OFFSET;
  QGraphicsViewPrivate *d;
  QRect *rect_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  rect_00 = in_RDI;
  this_00 = d_func((QGraphicsView *)0xa3ab1b);
  bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QGraphicsScene> *)0xa3ab31);
  if (bVar2) {
    QPointer<QGraphicsScene>::operator->((QPointer<QGraphicsScene> *)0xa3ab63);
    mapToScene(in_RSI,rect_00);
    viewportTransform((QGraphicsView *)rect_00);
    QGraphicsScene::items
              ((QGraphicsScene *)this_00,(QPolygonF *)in_RSI,
               (ItemSelectionMode)((ulong)rect_00 >> 0x20),(SortOrder)rect_00,(QTransform *)in_RDI);
    QPolygonF::~QPolygonF((QPolygonF *)0xa3abc0);
  }
  else {
    memset(in_RDI,0,0x18);
    QList<QGraphicsItem_*>::QList((QList<QGraphicsItem_*> *)0xa3ab50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QList<QGraphicsItem_*> *)rect_00;
  }
  __stack_chk_fail();
}

Assistant:

QList<QGraphicsItem *> QGraphicsView::items(const QRect &rect, Qt::ItemSelectionMode mode) const
{
    Q_D(const QGraphicsView);
    if (!d->scene)
        return QList<QGraphicsItem *>();
    return d->scene->items(mapToScene(rect), mode, Qt::DescendingOrder, viewportTransform());
}